

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O2

int N_VLinearSumVectorArray(int nvec,realtype a,N_Vector *X,realtype b,N_Vector *Y,N_Vector *Z)

{
  _func_int_int_realtype_N_Vector_ptr_realtype_N_Vector_ptr_N_Vector_ptr *UNRECOVERED_JUMPTABLE;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  UNRECOVERED_JUMPTABLE = (*Z)->ops->nvlinearsumvectorarray;
  if (UNRECOVERED_JUMPTABLE ==
      (_func_int_int_realtype_N_Vector_ptr_realtype_N_Vector_ptr_N_Vector_ptr *)0x0) {
    uVar3 = 0;
    uVar2 = (ulong)(uint)nvec;
    if (nvec < 1) {
      uVar2 = uVar3;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      (*(*Z)->ops->nvlinearsum)(a,X[uVar3],b,Y[uVar3],Z[uVar3]);
    }
    return 0;
  }
  iVar1 = (*UNRECOVERED_JUMPTABLE)(nvec,a,X,b,Y,Z);
  return iVar1;
}

Assistant:

int N_VLinearSumVectorArray(int nvec, realtype a, N_Vector* X,
                            realtype b, N_Vector* Y, N_Vector* Z)
{
  int i, ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(X[0]));

  if (Z[0]->ops->nvlinearsumvectorarray != NULL) {

    ier = Z[0]->ops->nvlinearsumvectorarray(nvec, a, X, b, Y, Z);

  } else {

    for (i=0; i<nvec; i++) {
      Z[0]->ops->nvlinearsum(a, X[i], b, Y[i], Z[i]);
    }
    ier = 0;

  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(X[0]));
  return(ier);
}